

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_decoder.h
# Opt level: O0

bool __thiscall
draco::AttributesDecoder::DecodeAttributes(AttributesDecoder *this,DecoderBuffer *in_buffer)

{
  ulong uVar1;
  undefined8 in_RSI;
  long *in_RDI;
  undefined1 local_1;
  
  uVar1 = (**(code **)(*in_RDI + 0x48))(in_RDI,in_RSI);
  if ((uVar1 & 1) == 0) {
    local_1 = false;
  }
  else {
    uVar1 = (**(code **)(*in_RDI + 0x50))(in_RDI,in_RSI);
    if ((uVar1 & 1) == 0) {
      local_1 = false;
    }
    else {
      uVar1 = (**(code **)(*in_RDI + 0x58))();
      if ((uVar1 & 1) == 0) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool DecodeAttributes(DecoderBuffer *in_buffer) override {
    if (!DecodePortableAttributes(in_buffer)) {
      return false;
    }
    if (!DecodeDataNeededByPortableTransforms(in_buffer)) {
      return false;
    }
    if (!TransformAttributesToOriginalFormat()) {
      return false;
    }
    return true;
  }